

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud_decoder.cc
# Opt level: O2

Status * __thiscall
draco::PointCloudDecoder::DecodeMetadata(Status *__return_storage_ptr__,PointCloudDecoder *this)

{
  unique_ptr<draco::GeometryMetadata,_std::default_delete<draco::GeometryMetadata>_> __p;
  bool bVar1;
  __uniq_ptr_data<draco::GeometryMetadata,_std::default_delete<draco::GeometryMetadata>,_true,_true>
  this_00;
  allocator<char> local_51;
  unique_ptr<draco::GeometryMetadata,_std::default_delete<draco::GeometryMetadata>_> metadata;
  MetadataDecoder metadata_decoder;
  __uniq_ptr_impl<draco::GeometryMetadata,_std::default_delete<draco::GeometryMetadata>_> local_40;
  string local_38 [32];
  
  this_00.
  super___uniq_ptr_impl<draco::GeometryMetadata,_std::default_delete<draco::GeometryMetadata>_>._M_t
  .super__Tuple_impl<0UL,_draco::GeometryMetadata_*,_std::default_delete<draco::GeometryMetadata>_>.
  super__Head_base<0UL,_draco::GeometryMetadata_*,_false>._M_head_impl =
       (__uniq_ptr_impl<draco::GeometryMetadata,_std::default_delete<draco::GeometryMetadata>_>)
       operator_new(0x78);
  GeometryMetadata::GeometryMetadata
            ((GeometryMetadata *)
             this_00.
             super___uniq_ptr_impl<draco::GeometryMetadata,_std::default_delete<draco::GeometryMetadata>_>
             ._M_t.
             super__Tuple_impl<0UL,_draco::GeometryMetadata_*,_std::default_delete<draco::GeometryMetadata>_>
             .super__Head_base<0UL,_draco::GeometryMetadata_*,_false>._M_head_impl);
  metadata._M_t.
  super___uniq_ptr_impl<draco::GeometryMetadata,_std::default_delete<draco::GeometryMetadata>_>._M_t
  .super__Tuple_impl<0UL,_draco::GeometryMetadata_*,_std::default_delete<draco::GeometryMetadata>_>.
  super__Head_base<0UL,_draco::GeometryMetadata_*,_false>._M_head_impl =
       (__uniq_ptr_data<draco::GeometryMetadata,_std::default_delete<draco::GeometryMetadata>,_true,_true>
        )(__uniq_ptr_data<draco::GeometryMetadata,_std::default_delete<draco::GeometryMetadata>,_true,_true>
          )this_00.
           super___uniq_ptr_impl<draco::GeometryMetadata,_std::default_delete<draco::GeometryMetadata>_>
           ._M_t.
           super__Tuple_impl<0UL,_draco::GeometryMetadata_*,_std::default_delete<draco::GeometryMetadata>_>
           .super__Head_base<0UL,_draco::GeometryMetadata_*,_false>._M_head_impl;
  MetadataDecoder::MetadataDecoder(&metadata_decoder);
  bVar1 = MetadataDecoder::DecodeGeometryMetadata
                    (&metadata_decoder,this->buffer_,
                     (GeometryMetadata *)
                     this_00.
                     super___uniq_ptr_impl<draco::GeometryMetadata,_std::default_delete<draco::GeometryMetadata>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_draco::GeometryMetadata_*,_std::default_delete<draco::GeometryMetadata>_>
                     .super__Head_base<0UL,_draco::GeometryMetadata_*,_false>._M_head_impl);
  __p = metadata;
  if (bVar1) {
    metadata._M_t.
    super___uniq_ptr_impl<draco::GeometryMetadata,_std::default_delete<draco::GeometryMetadata>_>.
    _M_t.
    super__Tuple_impl<0UL,_draco::GeometryMetadata_*,_std::default_delete<draco::GeometryMetadata>_>
    .super__Head_base<0UL,_draco::GeometryMetadata_*,_false>._M_head_impl =
         (__uniq_ptr_data<draco::GeometryMetadata,_std::default_delete<draco::GeometryMetadata>,_true,_true>
          )(__uniq_ptr_impl<draco::GeometryMetadata,_std::default_delete<draco::GeometryMetadata>_>)
           0x0;
    local_40._M_t.
    super__Tuple_impl<0UL,_draco::GeometryMetadata_*,_std::default_delete<draco::GeometryMetadata>_>
    .super__Head_base<0UL,_draco::GeometryMetadata_*,_false>._M_head_impl =
         (tuple<draco::GeometryMetadata_*,_std::default_delete<draco::GeometryMetadata>_>)
         (_Tuple_impl<0UL,_draco::GeometryMetadata_*,_std::default_delete<draco::GeometryMetadata>_>
         )0x0;
    std::__uniq_ptr_impl<draco::GeometryMetadata,_std::default_delete<draco::GeometryMetadata>_>::
    reset((__uniq_ptr_impl<draco::GeometryMetadata,_std::default_delete<draco::GeometryMetadata>_> *
          )&this->point_cloud_->metadata_,
          (pointer)__p._M_t.
                   super___uniq_ptr_impl<draco::GeometryMetadata,_std::default_delete<draco::GeometryMetadata>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_draco::GeometryMetadata_*,_std::default_delete<draco::GeometryMetadata>_>
                   .super__Head_base<0UL,_draco::GeometryMetadata_*,_false>._M_head_impl);
    std::unique_ptr<draco::GeometryMetadata,_std::default_delete<draco::GeometryMetadata>_>::
    ~unique_ptr((unique_ptr<draco::GeometryMetadata,_std::default_delete<draco::GeometryMetadata>_>
                 *)&local_40);
    __return_storage_ptr__->code_ = OK;
    (__return_storage_ptr__->error_msg_)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->error_msg_).field_2;
    (__return_storage_ptr__->error_msg_)._M_string_length = 0;
    (__return_storage_ptr__->error_msg_).field_2._M_local_buf[0] = '\0';
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              (local_38,"Failed to decode metadata.",&local_51);
    __return_storage_ptr__->code_ = DRACO_ERROR;
    std::__cxx11::string::string((string *)&__return_storage_ptr__->error_msg_,local_38);
    std::__cxx11::string::~string(local_38);
  }
  std::unique_ptr<draco::GeometryMetadata,_std::default_delete<draco::GeometryMetadata>_>::
  ~unique_ptr(&metadata);
  return __return_storage_ptr__;
}

Assistant:

Status PointCloudDecoder::DecodeMetadata() {
  std::unique_ptr<GeometryMetadata> metadata =
      std::unique_ptr<GeometryMetadata>(new GeometryMetadata());
  MetadataDecoder metadata_decoder;
  if (!metadata_decoder.DecodeGeometryMetadata(buffer_, metadata.get())) {
    return Status(Status::DRACO_ERROR, "Failed to decode metadata.");
  }
  point_cloud_->AddMetadata(std::move(metadata));
  return OkStatus();
}